

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

iterator __thiscall
bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::erase
          (pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_> *this,
          iterator first,iterator last)

{
  iterator pIVar1;
  void *in_RDX;
  iterator in_RSI;
  pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_> *in_RDI;
  
  pIVar1 = end(in_RDI);
  if (0 < ((long)pIVar1 - (long)in_RDX) / 0x18) {
    pIVar1 = end(in_RDI);
    memmove(in_RSI,in_RDX,(((long)pIVar1 - (long)in_RDX) / 0x18) * 0x18);
  }
  (in_RDI->ebo_).size = (in_RDI->ebo_).size - (int)(((long)in_RDX - (long)in_RSI) / 0x18);
  return in_RSI;
}

Assistant:

iterator erase(iterator first, iterator last) {
		if (end() - last > 0) {
			std::memmove(first, last, (end() - last) * sizeof(T));
		}
		ebo_.size -= static_cast<size_type>(last - first);
		return first;
	}